

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O3

void monster_turn(monster *mon)

{
  bitflag *pbVar1;
  uint32_t *puVar2;
  uint16_t **ppuVar3;
  short sVar4;
  ushort uVar5;
  monster_group_role mVar6;
  loc grid;
  loc grid_00;
  loc grid_01;
  monster_race *pmVar7;
  loc grid_02;
  loc grid1;
  loc grid1_00;
  artifact *paVar8;
  loc grid1_01;
  loc grid1_02;
  loc grid1_03;
  wchar_t *pwVar9;
  wchar_t *pwVar10;
  loc grid1_04;
  loc grid_03;
  short sVar11;
  object *obj;
  chunk_conflict *pcVar12;
  _Bool _Var13;
  wchar_t wVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  trap_kind_conflict *ptVar22;
  loc lVar23;
  int x;
  uint32_t uVar19;
  errr eVar20;
  square *psVar24;
  monster_lore *pmVar25;
  loc lVar26;
  _Bool _Var14;
  uint8_t uVar15;
  ulong uVar27;
  monster *pmVar28;
  monster *pmVar29;
  undefined7 extraout_var;
  object *poVar30;
  object *poVar31;
  undefined7 extraout_var_00;
  uint7 extraout_var_01;
  monster_conflict *pmVar32;
  loc grid_04;
  uint uVar21;
  loc_conflict lVar33;
  loc grid_05;
  byte bVar34;
  short sVar35;
  uint uVar36;
  loc *plVar37;
  undefined8 uVar38;
  wchar_t wVar39;
  char *pcVar40;
  wchar_t amount;
  int iVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  wchar_t tmp;
  ulong uVar45;
  long lVar46;
  loc lVar47;
  wchar_t wVar48;
  bool bVar49;
  bool bVar50;
  _Bool dead;
  char m_name [80];
  char ghost_name [80];
  loc local_1120;
  _Bool local_1111;
  loc local_1110;
  char local_1101;
  loc local_1100;
  uint32_t local_10f4;
  monster_lore *local_10f0;
  byte local_10e5;
  wchar_t local_10e4;
  uint8_t (*local_10e0) [8];
  loc local_10d8;
  loc local_10d0;
  wchar_t local_10c4;
  ulong local_10c0;
  monster_lore *local_10b8;
  uint16_t local_10aa;
  object *local_10a8;
  wchar_t local_109c;
  loc local_1098;
  ulong local_1090;
  undefined2 local_1088;
  undefined1 local_1086;
  wchar_t awStack_1040 [2];
  loc local_1038 [513];
  
  local_10b8 = get_lore(mon->race);
  local_1111 = false;
  monster_desc((char *)&local_1088,0x50,mon,L'̄');
  lVar23.x = (mon->grid).x;
  lVar23.y = (mon->grid).y;
  _Var13 = square_iswebbed(cave,lVar23);
  if (_Var13) {
    _Var13 = monster_is_visible(mon);
    if (_Var13) {
      pbVar1 = local_10b8->flags;
      flag_on_dbg(pbVar1,0xc,0x40,"lore->flags","RF_CLEAR_WEB");
      flag_on_dbg(pbVar1,0xc,0x41,"lore->flags","RF_PASS_WEB");
    }
    _Var13 = flag_has_dbg(mon->race->flags,0xc,0x41,"mon->race->flags","RF_PASS_WEB");
    if (!_Var13) {
      _Var13 = monster_is_visible(mon);
      if (_Var13) {
        pbVar1 = local_10b8->flags;
        flag_on_dbg(pbVar1,0xc,0x39,"lore->flags","RF_PASS_WALL");
        flag_on_dbg(pbVar1,0xc,0x3a,"lore->flags","RF_KILL_WALL");
      }
      _Var13 = flag_has_dbg(mon->race->flags,0xc,0x39,"mon->race->flags","RF_PASS_WALL");
      if (!_Var13) {
        _Var13 = monster_passes_walls(mon);
        if (!_Var13) {
          _Var13 = flag_has_dbg(mon->race->flags,0xc,0x40,"mon->race->flags","RF_CLEAR_WEB");
          if (!_Var13) {
            return;
          }
          ptVar22 = lookup_trap("web");
          if (ptVar22 != (trap_kind_conflict *)0x0) {
            lVar26.x = (mon->grid).x;
            lVar26.y = (mon->grid).y;
            square_remove_all_traps_of_type((chunk *)cave,lVar26,ptVar22->tidx);
            return;
          }
          __assert_fail("web",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                        ,0x696,"void monster_turn(struct monster *)");
        }
        ptVar22 = lookup_trap("web");
        if (ptVar22 == (trap_kind_conflict *)0x0) {
          __assert_fail("web",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                        ,0x68f,"void monster_turn(struct monster *)");
        }
        grid.x = (mon->grid).x;
        grid.y = (mon->grid).y;
        square_remove_all_traps_of_type((chunk *)cave,grid,ptVar22->tidx);
      }
    }
  }
  _Var13 = flag_has_dbg(mon->race->flags,0xc,0x25,"mon->race->flags","RF_TERRITORIAL");
  if ((_Var13) && (wVar16 = level_topography((int)player->place), wVar16 != L'\a')) {
    wVar17 = distance(mon->home,mon->grid);
    wVar16 = mon->race->hearing;
    iVar42 = wVar16 * 5;
    iVar43 = wVar17 * 6;
    uVar36 = 6;
    do {
      iVar43 = iVar43 - wVar17;
      uVar36 = uVar36 - 1;
      if (iVar43 != iVar42 && SBORROW4(iVar43,iVar42) == iVar43 + wVar16 * -5 < 0)
      goto LAB_0017f436;
    } while (1 < uVar36);
    uVar36 = 0;
LAB_0017f436:
    mon->energy = (mon->energy - (char)uVar36) + '\x05';
    wVar18 = distance(mon->home,(mon->target).grid);
    wVar16 = mon->race->hearing;
    wVar17 = wVar16 * 5;
    if (wVar18 != wVar17 && SBORROW4(wVar18,wVar17) == wVar18 + wVar16 * -5 < 0) {
      (mon->target).grid = mon->home;
    }
  }
  monster_group_rouse(cave,mon);
  lVar23 = (loc)get_lore(mon->race);
  if ((cave->num_repro < (int)(uint)z_info->repro_monster_max) &&
     (player->upkeep->arena_level == false)) {
    iVar42 = (mon->grid).x;
    iVar41 = 0;
    iVar43 = (mon->grid).y + -1;
    local_1100 = lVar23;
    do {
      x = iVar42 + -2;
      do {
        pcVar12 = cave;
        x = x + 1;
        lVar23 = (loc)loc(x,iVar43);
        psVar24 = square(pcVar12,lVar23);
        lVar23 = local_1100;
        iVar41 = iVar41 + (uint)(0 < psVar24->mon);
        iVar42 = (mon->grid).x;
      } while (x <= iVar42);
      bVar49 = iVar43 <= (mon->grid).y;
      iVar43 = iVar43 + 1;
    } while (bVar49);
    if ((iVar41 < 4) &&
       ((iVar41 == 0 || (uVar19 = Rand_div(iVar41 * (uint)z_info->repro_monster_rate), uVar19 == 0))
       )) {
      _Var13 = monster_is_visible(mon);
      if (_Var13) {
        flag_on_dbg((bitflag *)((long)lVar23 + 0x20),0xc,0x17,"lore->flags","RF_MULTIPLY");
      }
      _Var13 = flag_has_dbg(mon->race->flags,0xc,0x17,"mon->race->flags","RF_MULTIPLY");
      if ((_Var13) && (_Var13 = multiply_monster(mon), _Var13)) {
        _Var13 = monster_is_visible(mon);
        if (!_Var13) {
          return;
        }
        sound(0x9a);
        return;
      }
    }
  }
  uVar19 = Rand_div(0x10);
  if ((((uVar19 == 0) &&
       (_Var13 = flag_has_dbg(mon->race->flags,0xc,0x27,"mon->race->flags","RF_SPEAKING"), _Var13))
      && (_Var13 = los(cave,mon->grid,player->grid), _Var13)) && (mon->m_timed[3] == 0)) {
    _Var13 = monster_is_visible(mon);
    if (_Var13) {
      monster_desc((char *)&local_1088,0x50,mon,L'Ā');
    }
    else {
      local_1086 = 0;
      local_1088 = 0x7449;
    }
    eVar20 = get_rnd_line("bravado.txt",(char *)local_1038);
    if (eVar20 == 0) {
      msg("%s %s",&local_1088,local_1038);
    }
  }
  else {
    _Var13 = flag_has_dbg(mon->race->flags,0xc,2,"mon->race->flags","RF_PLAYER_GHOST");
    if (_Var13) {
      if (cave->ghost == (ghost_info *)0x0) {
        __assert_fail("cave->ghost",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                      ,0x6cd,"void monster_turn(struct monster *)");
      }
      grid_00.x = (mon->grid).x;
      grid_00.y = (mon->grid).y;
      _Var13 = square_isview(cave,grid_00);
      if (((_Var13) && (cave->ghost->string_type == L'\x01')) &&
         ((cave->ghost->has_spoken == false && (uVar19 = Rand_div(3), uVar19 == 0)))) {
        monster_desc((char *)local_1038,0x50,mon,L'\x80');
        msg("%s says: \'%s\'",local_1038,cave->ghost->string);
        cave->ghost->has_spoken = true;
      }
    }
  }
  _Var13 = make_ranged_attack((monster_conflict *)mon);
  if (_Var13) {
    return;
  }
  pmVar25 = get_lore(mon->race);
  wVar16 = monster_effect_level(mon,L'\x02');
  uVar45 = 0;
  for (; iVar42 = (int)uVar45, wVar16 != L'\0'; wVar16 = wVar16 + L'\xffffffff') {
    iVar42 = (int)((ulong)((long)((100 - iVar42) * 0x46) * -0x51eb851f) >> 0x20);
    uVar45 = (ulong)(((iVar42 >> 5) - (iVar42 >> 0x1f)) + 100);
  }
  _Var13 = flag_has_dbg(mon->race->flags,0xc,0x1c,"mon->race->flags","RF_RAND_25");
  uVar27 = uVar45;
  if (_Var13) {
    uVar27 = (ulong)(iVar42 + 0x19);
    _Var13 = monster_is_visible(mon);
    if (_Var13) {
      flag_on_dbg(pmVar25->flags,0xc,0x1c,"lore->flags","RF_RAND_25");
    }
  }
  iVar43 = (int)uVar27;
  _Var13 = flag_has_dbg(mon->race->flags,0xc,0x1d,"mon->race->flags","RF_RAND_50");
  if (_Var13) {
    iVar43 = iVar43 + 0x32;
    _Var13 = monster_is_visible(mon);
    if (_Var13) {
      flag_on_dbg(pmVar25->flags,0xc,0x1d,"lore->flags","RF_RAND_50");
    }
  }
  local_10f4 = Rand_div(100);
  local_10e5 = iVar42 <= (int)local_10f4;
  local_1101 = iVar43 <= (int)local_10f4 && (bool)local_10e5;
  local_10c0 = uVar45;
  if (iVar43 <= (int)local_10f4 && (bool)local_10e5) {
    lVar23 = monster_target_loc((monster_conflict *)mon);
    _Var13 = flag_has_dbg(mon->race->flags,0xc,5,"mon->race->flags","RF_GROUP_AI");
    local_1098.x._0_1_ = _Var13;
    lVar26 = (loc)loc(0,0);
    uVar36 = (uint)z_info->flee_range + (uint)z_info->max_sight;
    local_10e0 = (uint8_t (*) [8])CONCAT44(local_10e0._4_4_,uVar36);
    if (mon->m_timed[3] == 0) {
      _Var13 = flag_has_dbg(mon->race->flags,0xc,0x19,"mon->race->flags","RF_FRIGHTENED");
      uVar36 = (uint)local_10e0;
      if (_Var13) goto LAB_0017f9ad;
      mVar6 = mon->group_info[0].role;
      mon->min_range = '\x01';
      uVar21 = 1;
      if (mVar6 == MON_GROUP_BODYGUARD) goto LAB_0017f9b5;
      if (player->timed[0x30] == 0) {
        uVar5 = player->lev;
        uVar44 = mon->race->level + (mon->midx & 8U) + 0x19U & 0xffff;
        if ((uVar44 + 3 < (uint)uVar5) ||
           (((int)(uVar44 - 5) < (int)(uint)uVar5 &&
            ((uVar44 * (ushort)mon->maxhp + (uint)(ushort)mon->hp * 4) * (uint)(ushort)player->mhp <
             ((uint)uVar5 * (uint)(ushort)player->mhp + (uint)(ushort)player->chp * 4) *
             (uint)(ushort)mon->maxhp)))) goto LAB_0017f9ad;
        goto LAB_0017f9b5;
      }
    }
    else {
LAB_0017f9ad:
      mon->min_range = (uint8_t)uVar36;
      uVar21 = uVar36;
LAB_0017f9b5:
      if ((uVar21 & 0xff) < uVar36) {
        _Var13 = flag_has_dbg(mon->race->flags,0xc,0x1b,"mon->race->flags","RF_NEVER_MOVE");
        if (_Var13) {
          mon->min_range = mon->min_range + '\x03';
        }
        _Var13 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
        bVar34 = mon->min_range;
        if (_Var13) {
          bVar34 = bVar34 + 3;
          mon->min_range = bVar34;
        }
        uVar21 = (uint)bVar34;
        uVar36 = (uint)local_10e0;
      }
      uVar15 = (uint8_t)uVar21;
      if ((uVar36 <= (uVar21 & 0xff)) || (uVar36 = 1, (ushort)mon->cdis < z_info->turn_range)) {
        uVar15 = (uint8_t)uVar36;
        mon->min_range = uVar15;
      }
      mon->best_range = uVar15;
      _Var13 = monster_loves_archery(mon);
      if (_Var13) {
        mon->best_range = mon->best_range + '\x03';
      }
      if (mon->race->freq_innate < L'\x19') {
        if (L'\x18' < mon->race->freq_spell) {
          uVar15 = mon->best_range + '\x03';
          goto LAB_00180bb3;
        }
      }
      else {
        _Var13 = monster_breathes(mon);
        if ((_Var13) &&
           ((short)((uint)(int)(short)(mon->maxhp - (mon->maxhp >> 0xf)) >> 1) < mon->hp)) {
          uVar15 = mon->best_range + (mon->best_range == '\0');
LAB_00180bb3:
          mon->best_range = uVar15;
        }
      }
    }
    local_10d8 = lVar26;
    local_10d0 = lVar23;
    local_1120 = monster_target_loc((monster_conflict *)mon);
    if ((mon->group_info[0].role == MON_GROUP_BODYGUARD) &&
       (pmVar32 = (monster_conflict *)monster_group_leader(cave,mon),
       pmVar32 != (monster_conflict *)0x0)) {
      wVar16 = distance(mon->grid,(loc_conflict)pmVar32->grid);
      local_1100.x = wVar16;
      if (wVar16 < L'\x02') goto LAB_00180e45;
      _Var13 = los(cave,mon->grid,(loc_conflict)pmVar32->grid);
      if ((10 < (uint)local_1100.x) && (!_Var13)) goto LAB_00180e45;
      lVar46 = 0;
      local_10f0 = (monster_lore *)0x0;
      do {
        lVar46 = lVar46 + 1;
        while( true ) {
          lVar23 = (loc)loc_sum(mon->grid,*(loc_conflict *)(&UNK_0021a2a8 + lVar46 * 8));
          wVar16 = distance((loc_conflict)lVar23,(loc_conflict)pmVar32->grid);
          lVar26 = monster_target_loc(pmVar32);
          wVar17 = distance((loc_conflict)lVar23,(loc_conflict)lVar26);
          _Var13 = square_in_bounds(cave,lVar23);
          if ((_Var13) &&
             ((((_Var13 = monster_can_kill(mon,(loc_conflict)lVar23), _Var13 ||
                (_Var13 = monster_can_move(mon,(loc_conflict)lVar23), _Var13)) &&
               (_Var13 = monster_hates_grid(mon,(loc_conflict)lVar23), !_Var13)) &&
              (wVar16 < local_1100.x)))) break;
          lVar46 = lVar46 + 1;
          if (lVar46 == 9) {
            lVar23 = local_1110;
            if (((ulong)local_10f0 & 1) != 0) goto LAB_00180e39;
            goto LAB_00180e45;
          }
        }
      } while (((int)(uint)mon->cdis <= wVar17) &&
              (local_10f0 = (monster_lore *)0x1, local_1110 = lVar23, lVar46 != 8));
LAB_00180e39:
      (mon->target).grid.x = lVar23.x;
      (mon->target).grid.y = lVar23.y;
LAB_00180ef0:
      local_1110 = (loc)((ulong)local_1110 & 0xffffffff00000000);
LAB_001811ef:
      lVar23 = local_10d0;
      grid_04 = (loc)loc_diff((mon->target).grid,mon->grid);
      flag_on_dbg(mon->mflag,2,10,"mon->mflag","MFLAG_TRACKING");
    }
    else {
LAB_00180e45:
      uVar45 = (ulong)local_1120 >> 0x20;
      _Var13 = monster_passes_walls(mon);
      if (_Var13) {
        lVar23 = monster_target_loc((monster_conflict *)mon);
        grid1_01.x = (mon->grid).x;
        grid1_01.y = (mon->grid).y;
        _Var13 = projectable((chunk *)cave,grid1_01,lVar23,L'\0');
        if (!_Var13) {
          uVar19 = Rand_div(99);
          if ((int)uVar19 < 5) goto LAB_00180eb9;
          grid1_03.x = (mon->grid).x;
          grid1_03.y = (mon->grid).y;
          wVar16 = project_path((chunk *)cave,local_1038,(uint)z_info->max_sight,grid1_03,lVar23,
                                L'耀');
          if (L'\0' < wVar16) {
            lVar46 = 0;
            do {
              _Var13 = square_isperm(cave,local_1038[lVar46]);
              if (_Var13) goto LAB_00180eb9;
              _Var13 = loc_eq((loc_conflict)local_1038[lVar46],(loc_conflict)lVar23);
            } while ((!_Var13) &&
                    (bVar49 = (ulong)(uint)wVar16 - 1 != lVar46, lVar46 = lVar46 + 1, bVar49));
          }
        }
        (mon->target).grid.x = local_1120.x;
        (mon->target).grid.y = local_1120.y;
        local_1110 = (loc)((ulong)local_1110 & 0xffffffff00000000);
        goto LAB_001811ef;
      }
LAB_00180eb9:
      pcVar12 = cave;
      if ((((mon->target).midx == -1) && (player->timed[0x2e] != 0)) &&
         (z_info->max_sight >> 2 < (ushort)mon->cdis)) {
LAB_00180f68:
        lVar47 = (loc)(cave->noise).grids;
        local_10f0 = (monster_lore *)(cave->scent).grids;
      }
      else {
        lVar23 = monster_target_loc((monster_conflict *)mon);
        grid1_02.x = (mon->grid).x;
        grid1_02.y = (mon->grid).y;
        _Var13 = projectable((chunk *)pcVar12,grid1_02,lVar23,L'\0');
        if (_Var13) {
          (mon->target).grid.x = local_1120.x;
          (mon->target).grid.y = local_1120.y;
          goto LAB_00180ef0;
        }
        wVar16 = (mon->target).midx;
        if (wVar16 == L'\xffffffff') goto LAB_00180f68;
        if (wVar16 < L'\x01') {
          local_10f0 = (monster_lore *)0x0;
          lVar47.x = L'\0';
          lVar47.y = L'\0';
        }
        else {
          pmVar28 = cave_monster(cave,wVar16);
          lVar47 = (loc)(pmVar28->noise).grids;
          local_10f0 = (monster_lore *)0x0;
        }
      }
      _Var13 = monster_can_hear(mon);
      if (_Var13) {
        local_10aa = (*(uint16_t **)((long)lVar47 + (long)(mon->grid).y * 8))[(mon->grid).x];
        lVar46 = 0;
        local_10e4 = L'\0';
        local_1110 = lVar47;
        local_1090 = uVar45;
        do {
          lVar23 = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid_ddd[lVar46]);
          wVar16 = lVar23.x;
          local_1100.x._0_2_ = (*(uint16_t **)((long)lVar47 + ((long)lVar23 >> 0x20) * 8))[wVar16];
          _Var13 = square_in_bounds(cave,lVar23);
          if ((((_Var13) &&
               (ppuVar3 = (uint16_t **)((long)lVar47 + ((long)lVar23 >> 0x20) * 8),
               lVar47 = local_1110, (*ppuVar3)[wVar16] != 0)) &&
              ((_Var13 = monster_can_kill(mon,(loc_conflict)lVar23), lVar47 = local_1110, _Var13 ||
               (_Var13 = monster_can_move(mon,(loc_conflict)lVar23), _Var13)))) &&
             (_Var13 = monster_hates_grid(mon,(loc_conflict)lVar23), !_Var13)) {
            uVar45 = (ulong)lVar23 >> 0x20;
            bVar49 = local_10aa == (uint16_t)local_1100.x;
            if ((uint16_t)local_1100.x <= local_10aa && !bVar49) {
              bVar49 = true;
              local_1120 = lVar23;
              goto LAB_0018115a;
            }
            if (bVar49) {
              local_10c4 = lVar23.y;
              local_109c = wVar16;
            }
            local_10e4 = CONCAT31((int3)((uint)local_10e4 >> 8),(byte)local_10e4 | bVar49);
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 != 8);
        bVar49 = false;
        uVar45 = local_1090;
      }
      else {
        bVar49 = false;
        local_10e4 = L'\0';
      }
LAB_0018115a:
      iVar42 = (int)uVar45;
      _Var13 = monster_can_smell(mon);
      if ((_Var13) && (!bVar49)) {
        lVar46 = 0;
        iVar43 = 0;
        do {
          lVar23 = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid_ddd[lVar46]);
          uVar5 = *(ushort *)
                   (*(long *)(local_10f0->flags + ((long)lVar23 >> 0x20) * 8 + -0x20) +
                   (long)lVar23.x * 2);
          if ((uVar5 != 0) && (iVar42 = mon->race->smell - (uint)uVar5, iVar43 < iVar42)) {
            uVar45 = (ulong)lVar23 >> 0x20;
            bVar49 = true;
            iVar43 = iVar42;
            local_1120 = lVar23;
          }
          iVar42 = (int)uVar45;
          lVar46 = lVar46 + 1;
        } while (lVar46 != 8);
      }
      lVar23 = local_10d0;
      if (bVar49) {
        (mon->target).grid.x = local_1120.x;
        (mon->target).grid.y = iVar42;
        local_1110.x = (wchar_t)CONCAT71(local_1120._1_7_,1);
        goto LAB_001811ef;
      }
      if ((local_10e4 & 1U) != 0) {
        (mon->target).grid.x = local_109c;
        (mon->target).grid.y = local_10c4;
        local_1110.x = (wchar_t)CONCAT71((uint7)(uint3)((uint)local_10c4 >> 8),1);
        goto LAB_001811ef;
      }
      pmVar28 = group_monster_tracking(cave,mon);
      if ((pmVar28 == (monster *)0x0) || (_Var13 = los(cave,mon->grid,pmVar28->grid), !_Var13)) {
        _Var13 = flag_has_dbg(mon->mflag,2,10,"mon->mflag","MFLAG_TRACKING");
        grid_04 = local_10d8;
        if (_Var13) {
          grid_04 = (loc)loc_diff((mon->target).grid,mon->grid);
        }
        _Var13 = loc_is_zero((loc_conflict)grid_04);
        if (!_Var13) goto LAB_001816a1;
        local_1038[2].x = L'\x04';
        local_1038[2].y = L'\x05';
        local_1038[3].x = L'\x06';
        local_1038[3].y = L'\a';
        local_1038[0].x = L'\0';
        local_1038[0].y = L'\x01';
        local_1038[1].x = L'\x02';
        local_1038[1].y = L'\x03';
        uVar45 = 9;
        local_1100 = (loc)mon->mflag;
        do {
          uVar19 = Rand_div((int)uVar45 - 1);
          wVar16 = (&local_1038[0].x)[(int)uVar19];
          local_10d8 = ddgrid_ddd[wVar16];
          lVar23 = (loc)loc_sum(mon->grid,(loc_conflict)local_10d8);
          _Var13 = square_is_monster_walkable(cave,lVar23);
          if ((_Var13) && (_Var13 = monster_hates_grid(mon,(loc_conflict)lVar23), !_Var13))
          goto LAB_0018166f;
          (&local_1038[0].x)[(int)uVar19] = awStack_1040[uVar45];
          awStack_1040[uVar45] = wVar16;
          uVar45 = uVar45 - 1;
        } while (1 < uVar45);
        local_10d8 = (loc)loc(0,0);
LAB_0018166f:
        flag_off((bitflag *)local_1100,2,10);
        local_1110 = (loc)((ulong)local_1110 & 0xffffffff00000000);
        lVar23 = local_10d0;
        grid_04 = local_10d8;
      }
      else {
        grid_04 = (loc)loc_diff(pmVar28->grid,mon->grid);
        flag_off(mon->mflag,2,10);
LAB_001816a1:
        local_1110 = (loc)((ulong)local_1110 & 0xffffffff00000000);
      }
    }
    _Var13 = monster_taking_terrain_damage((chunk *)cave,(monster_conflict *)mon);
    if ((_Var13) && (_Var13 = get_move_find_safety(mon), _Var13)) {
      get_move_flee(mon);
      grid_04 = (loc)loc_diff((mon->target).grid,mon->grid);
    }
    else if ((char)local_1098.x == '\0') {
      if ((uint)local_10e0 != mon->min_range) goto LAB_0018182c;
LAB_00181739:
      _Var13 = get_move_find_safety(mon);
      if (_Var13) {
        get_move_flee(mon);
        grid_04.x = (mon->grid).x;
        grid_04.y = (mon->grid).y;
        lVar33 = (mon->target).grid;
      }
      else {
        lVar33 = loc(0,0);
      }
      grid_04 = (loc)loc_diff(lVar33,(loc_conflict)grid_04);
      flag_off(mon->mflag,2,10);
    }
    else {
      _Var13 = monster_passes_walls(mon);
      if (_Var13) {
        if ((uint)local_10e0 == mon->min_range) goto LAB_00181739;
      }
      else {
        lVar46 = 0;
        iVar42 = 0;
        local_10d8 = grid_04;
        do {
          lVar26 = (loc)loc_sum((loc_conflict)lVar23,(loc_conflict)ddgrid_ddd[lVar46]);
          _Var13 = square_ispassable(cave,lVar26);
          if ((_Var13) || (_Var13 = square_isroom(cave,lVar26), _Var13)) {
            iVar42 = iVar42 + 1;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 != 8);
        wVar16 = (mon->target).midx;
        if (wVar16 == L'\xffffffff') {
          sVar4 = player->chp;
          sVar35 = (short)((uint)(int)(short)(player->mhp - (player->mhp >> 0xf)) >> 1);
          bVar50 = SBORROW2(sVar4,sVar35);
          sVar11 = sVar4 - sVar35;
          bVar49 = sVar4 == sVar35;
LAB_001813e5:
          if ((iVar42 < 5) && (!bVar49 && bVar50 == sVar11 < 0)) {
            local_1098 = monster_target_loc((monster_conflict *)mon);
            wVar16 = distance((loc_conflict)local_1098,mon->grid);
            iVar42 = wVar16 * 3 + 3;
            if (-1 < wVar16 * 3) {
              iVar42 = wVar16 * 3;
            }
            local_10e4 = (iVar42 >> 2) + L'\x02';
            wVar16 = L'ϧ';
            bVar49 = true;
            pmVar25 = (monster_lore *)0x1;
            do {
              local_10c4 = CONCAT31(local_10c4._1_3_,bVar49);
              local_1100 = (loc)loc(0,0);
              pwVar9 = dist_offsets_y[(long)pmVar25];
              pwVar10 = dist_offsets_x[(long)pmVar25];
              wVar17 = *pwVar9;
              wVar18 = *pwVar10;
              local_10f0 = pmVar25;
              if (wVar18 != L'\0' || wVar17 != L'\0') {
                lVar46 = 4;
                do {
                  lVar33 = loc(wVar18,wVar17);
                  lVar23 = (loc)loc_sum(mon->grid,lVar33);
                  _Var13 = square_in_bounds_fully(cave,lVar23);
                  if ((((_Var13) && (_Var13 = square_isempty(cave,lVar23), _Var13)) &&
                      (_Var13 = square_isview(cave,lVar23), !_Var13)) &&
                     ((grid1_04.x = (mon->grid).x, grid1_04.y = (mon->grid).y,
                      _Var13 = projectable((chunk *)cave,grid1_04,lVar23,L'\b'), _Var13 &&
                      (wVar17 = distance((loc_conflict)lVar23,(loc_conflict)local_1098),
                      local_10e4 <= wVar17 && wVar17 < wVar16)))) {
                    local_1100 = lVar23;
                    wVar16 = wVar17;
                  }
                  wVar17 = *(wchar_t *)((long)pwVar9 + lVar46);
                  wVar18 = *(wchar_t *)((long)pwVar10 + lVar46);
                  lVar46 = lVar46 + 4;
                } while (wVar17 != L'\0' || wVar18 != L'\0');
                if (wVar16 < L'ϧ') {
                  (mon->target).grid.x = local_1100.x;
                  (mon->target).grid.y = local_1100.y;
                  if ((local_10c4 & 1U) != 0) {
                    grid_04 = (loc)loc_diff((loc_conflict)local_1100,mon->grid);
                    flag_off(mon->mflag,2,10);
                    goto LAB_0018182c;
                  }
                  break;
                }
              }
              bVar49 = local_10f0 < (monster_lore *)0x9;
              pmVar25 = (monster_lore *)((long)&local_10f0->ridx + 1);
            } while (pmVar25 != (monster_lore *)0xa);
          }
        }
        else if (L'\0' < wVar16) {
          pmVar28 = cave_monster(cave,wVar16);
          sVar4 = mon->hp;
          sVar35 = pmVar28->hp;
          bVar50 = SBORROW2(sVar4,sVar35);
          sVar11 = sVar4 - sVar35;
          bVar49 = sVar4 == sVar35;
          goto LAB_001813e5;
        }
        grid_04 = local_10d8;
        if ((uint)local_10e0 == mon->min_range) goto LAB_00181739;
      }
      grid_03.x = (mon->grid).x;
      grid_03.y = (mon->grid).y;
      _Var13 = square_isview(cave,grid_03);
      if (_Var13) {
        if (mon->cdis < 2) {
          grid_05.x = (mon->target).grid.x;
          grid_05.y = (mon->target).grid.y;
        }
        else {
          uVar19 = Rand_div(8);
          iVar42 = 0;
          do {
            uVar21 = uVar19 + iVar42;
            uVar36 = uVar19 + 7 + iVar42;
            if (-1 < (int)uVar21) {
              uVar36 = uVar21;
            }
            grid_05 = (loc)loc_sum((loc_conflict)local_10d0,
                                   (loc_conflict)ddgrid_ddd[(int)(uVar21 - (uVar36 & 0xfffffff8))]);
            _Var13 = square_isempty(cave,grid_05);
          } while ((!_Var13) && (bVar49 = iVar42 != 7, iVar42 = iVar42 + 1, bVar49));
        }
        grid_04 = (loc)loc_diff((loc_conflict)grid_05,mon->grid);
      }
    }
LAB_0018182c:
    _Var13 = loc_is_zero((loc_conflict)grid_04);
    if (_Var13) {
      return;
    }
    wVar18 = grid_04.y;
    wVar17 = -wVar18;
    if (-1 < (long)grid_04) {
      wVar17 = wVar18;
    }
    wVar48 = grid_04.x;
    wVar39 = -wVar48;
    if (L'\0' < wVar48) {
      wVar39 = wVar48;
    }
    wVar16 = local_1110.x;
    if (wVar17 == wVar39 * 2 || SBORROW4(wVar17,wVar39 * 2) != wVar17 + wVar39 * -2 < 0) {
      if (wVar39 == wVar17 * 2 || SBORROW4(wVar39,wVar17 * 2) != wVar39 + wVar17 * -2 < 0) {
        if (wVar18 == L'\0' || (long)grid_04 < 0) {
          if (wVar48 < L'\x01') {
            if ((wVar17 < wVar39) || ((lVar46 = 7, wVar17 == wVar39 && (((byte)turn & 1) == 0)))) {
              lVar46 = 0x11;
            }
          }
          else if ((wVar39 < wVar17) || ((lVar46 = 9, wVar17 == wVar39 && (((byte)turn & 1) == 0))))
          {
            lVar46 = 0x13;
          }
        }
        else if (wVar48 < L'\x01') {
          if ((wVar39 < wVar17) || ((lVar46 = 1, wVar17 == wVar39 && (((byte)turn & 1) == 0)))) {
            lVar46 = 0xb;
          }
        }
        else if ((wVar17 < wVar39) || ((lVar46 = 3, wVar17 == wVar39 && (((byte)turn & 1) == 0)))) {
          lVar46 = 0xd;
        }
      }
      else if (wVar48 < L'\x01') {
        if ((wVar18 != L'\0' && -1 < (long)grid_04) ||
           ((lVar46 = 4, (ulong)grid_04 >> 0x20 == 0 && (((byte)turn & 1) == 0)))) {
          lVar46 = 0xe;
        }
      }
      else if (((long)grid_04 < 0) ||
              ((lVar46 = 6, (ulong)grid_04 >> 0x20 == 0 && (((byte)turn & 1) == 0)))) {
        lVar46 = 0x10;
      }
    }
    else if (wVar18 == L'\0' || (long)grid_04 < 0) {
      if ((wVar48 < L'\0') || ((lVar46 = 8, wVar48 == L'\0' && (((byte)turn & 1) == 0)))) {
        lVar46 = 0x12;
      }
    }
    else if ((L'\0' < wVar48) || ((lVar46 = 2, wVar48 == L'\0' && (((byte)turn & 1) == 0)))) {
      lVar46 = 0xc;
    }
  }
  else {
    lVar46 = 0;
    wVar16 = L'\0';
  }
  local_1110 = (loc)(CONCAT44(local_1110.y,wVar16) ^ 1);
  local_10b8 = (monster_lore *)local_10b8->flags;
  local_10e0 = side_dirs + lVar46;
  local_10d0 = (loc)(CONCAT71(local_10d0._1_7_,local_1101) ^ 1);
  uVar45 = 0;
  wVar16 = L'\0';
LAB_0017fa7f:
  local_1100.x = wVar16;
  if (local_1101 == '\0') {
    uVar19 = Rand_div(8);
    uVar27 = (ulong)ddd[(int)uVar19];
  }
  else {
    uVar27 = (ulong)(*local_10e0)[uVar45];
  }
  plVar37 = ddgrid;
  lVar23 = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid[uVar27]);
  if (uVar45 != 0 && (char)local_10d0.x == '\0') {
    grid_01.x = (mon->grid).x;
    grid_01.y = (mon->grid).y;
    _Var13 = square_isview(cave,grid_01);
    if ((_Var13 | (byte)local_1110.x) == 1) goto LAB_0017faeb;
LAB_00180b06:
    goto LAB_00180b0a;
  }
LAB_0017faeb:
  local_10f0 = get_lore(mon->race);
  _Var13 = square_isplayer(cave,lVar23);
  if ((_Var13) || (_Var13 = square_isdecoyed(cave,lVar23), _Var13)) goto LAB_0017fb26;
  if (((int)local_10c0 <= (int)local_10f4) &&
     (_Var13 = monster_hates_grid(mon,(loc_conflict)lVar23), _Var13)) goto LAB_0018067b;
  _Var13 = square_ispassable(cave,lVar23);
  if (_Var13) {
    pmVar7 = mon->race;
    _Var13 = square_iswatery(cave,lVar23);
    if (!_Var13) {
      _Var13 = square_isfiery(cave,lVar23);
      if (_Var13) {
        plVar37 = (loc *)0x22c425;
        _Var13 = flag_has_dbg(pmVar7->flags,0xc,0x52,"race->flags","RF_IM_FIRE");
        if (!_Var13) {
          plVar37 = (loc *)0x22c425;
          _Var13 = flag_has_dbg(pmVar7->flags,0xc,0x22,"race->flags","RF_FLYING");
          if ((!_Var13) || (mon->hp < 0x32)) goto LAB_0018067b;
        }
      }
      else {
        _Var13 = square_isrubble(cave,lVar23);
        if (_Var13) {
          plVar37 = (loc *)0x22c425;
          _Var13 = flag_has_dbg(pmVar7->flags,0xc,0x39,"race->flags","RF_PASS_WALL");
          if (!_Var13) {
            plVar37 = (loc *)0x22c425;
            _Var13 = flag_has_dbg(pmVar7->flags,0xc,0x3a,"race->flags","RF_KILL_WALL");
            if (!_Var13) {
              iVar42 = 0x3b;
              pcVar40 = "RF_SMASH_WALL";
LAB_0018070f:
              plVar37 = (loc *)0x22c425;
              _Var13 = flag_has_dbg(pmVar7->flags,0xc,iVar42,"race->flags",pcVar40);
              if (!_Var13) {
                uVar19 = Rand_div(2);
                goto LAB_0018093e;
              }
            }
          }
        }
        else {
          _Var13 = square_istree(cave,lVar23);
          if (_Var13) {
            plVar37 = (loc *)0x22c425;
            _Var13 = flag_has_dbg(pmVar7->flags,0xc,0x39,"race->flags","RF_PASS_WALL");
            if (!_Var13) {
              plVar37 = (loc *)0x22c425;
              _Var13 = flag_has_dbg(pmVar7->flags,0xc,0x22,"race->flags","RF_FLYING");
              if (!_Var13) {
                iVar42 = 0x47;
                pcVar40 = "RF_ANIMAL";
                goto LAB_0018070f;
              }
            }
          }
          else {
            _Var13 = square_isfall(cave,lVar23);
            if (_Var13) {
              plVar37 = (loc *)0x22c425;
              _Var13 = flag_has_dbg(pmVar7->flags,0xc,0x22,"race->flags","RF_FLYING");
              if (!_Var13) goto LAB_0018067b;
            }
          }
        }
      }
      goto LAB_0017fb26;
    }
    pbVar1 = pmVar7->flags;
    plVar37 = (loc *)0x22c425;
    _Var13 = flag_has_dbg(pbVar1,0xc,0x22,"race->flags","RF_FLYING");
    if (_Var13) goto LAB_0017fb26;
    _Var13 = flag_has_dbg(pmVar7->spell_flags,0xd,9,"race->spell_flags","RSF_BR_FIRE");
    if ((!_Var13) && (_Var13 = flag_has_dbg(pbVar1,0xc,0x46,"race->flags","RF_DEMON"), !_Var13)) {
      plVar37 = (loc *)0x22c425;
      _Var13 = flag_has_dbg(pbVar1,0xc,0x23,"race->flags","RF_HUMANOID");
      if (_Var13) {
        uVar19 = Rand_div(4);
        if (uVar19 == 0) goto LAB_0018067b;
      }
      else {
        plVar37 = (loc *)0x22c425;
        _Var13 = flag_has_dbg(pbVar1,0xc,0x49,"race->flags","RF_UNDEAD");
        if (_Var13) {
          uVar19 = Rand_div(2);
LAB_0018093e:
          if (uVar19 != 0) goto LAB_0018067b;
        }
      }
      goto LAB_0017fb26;
    }
  }
  else {
    _Var13 = square_isperm(cave,lVar23);
    if (_Var13) goto LAB_0017fe33;
    _Var13 = monster_is_visible(mon);
    if (_Var13) {
      pbVar1 = local_10f0->flags;
      flag_on_dbg(pbVar1,0xc,0x39,"lore->flags","RF_PASS_WALL");
      flag_on_dbg(pbVar1,0xc,0x3a,"lore->flags","RF_KILL_WALL");
      flag_on_dbg(pbVar1,0xc,0x3b,"lore->flags","RF_SMASH_WALL");
    }
    plVar37 = (loc *)0x22c420;
    _Var13 = flag_has_dbg(mon->race->flags,0xc,0x39,"mon->race->flags","RF_PASS_WALL");
    if (_Var13) goto LAB_0017fb26;
    plVar37 = (loc *)0x22c420;
    _Var13 = flag_has_dbg(mon->race->flags,0xc,0x3b,"mon->race->flags","RF_SMASH_WALL");
    if (_Var13) {
      square_smash_wall(cave,lVar23);
    }
    else {
      plVar37 = (loc *)0x22c420;
      _Var13 = flag_has_dbg(mon->race->flags,0xc,0x3a,"mon->race->flags","RF_KILL_WALL");
      if (!_Var13) {
        _Var13 = square_iscloseddoor(cave,lVar23);
        if ((!_Var13) && (_Var13 = square_issecretdoor(cave,lVar23), !_Var13)) {
LAB_0017fe33:
          if ((int)local_10c0 <= (int)local_10f4) goto LAB_0018067b;
          monster_display_confused_move_msg(mon,(char *)&local_1088,(loc_conflict)lVar23);
          monster_slightly_stun_by_move(mon);
          goto LAB_00180d12;
        }
        bVar49 = (int)local_10f4 < (int)local_10c0;
        _Var13 = flag_has_dbg(mon->race->flags,0xc,0x37,"mon->race->flags","RF_OPEN_DOOR");
        _Var14 = flag_has_dbg(mon->race->flags,0xc,0x38,"mon->race->flags","RF_BASH_DOOR");
        if (_Var14 && bVar49) {
          uVar19 = Rand_div(3);
          _Var14 = uVar19 == 0;
        }
        bVar34 = _Var13 & local_10e5;
        wVar16 = local_1100.x & 0xff;
        if (bVar34 != 0 || _Var14 != false) {
          wVar16 = L'\x01';
        }
        plVar37 = (loc *)0x0;
        local_1100.x = wVar16;
        uVar27 = (ulong)local_10f4;
        if ((int)local_10c0 <= (int)local_10f4) {
          _Var13 = monster_is_visible(mon);
          uVar27 = CONCAT71(extraout_var_00,_Var13);
          if (_Var13) {
            pbVar1 = local_10f0->flags;
            flag_on_dbg(pbVar1,0xc,0x37,"lore->flags","RF_OPEN_DOOR");
            plVar37 = (loc *)0x237926;
            flag_on_dbg(pbVar1,0xc,0x38,"lore->flags","RF_BASH_DOOR");
            uVar27 = (ulong)extraout_var_01 << 8;
          }
        }
        if (bVar34 == 0) {
          wVar16 = (wchar_t)CONCAT71((int7)(uVar27 >> 8),1);
          if (_Var14 == false) goto LAB_0017fe33;
        }
        else if (_Var14 == false) {
          wVar16 = L'\0';
        }
        else {
          uVar19 = Rand_div(2);
          wVar16 = CONCAT31((int3)(uVar19 >> 8),uVar19 == 0);
        }
        local_10d8.x = wVar16;
        _Var13 = square_islockeddoor(cave,lVar23);
        if (_Var13) {
          wVar16 = square_door_power((chunk *)cave,lVar23);
          wVar17 = Rand_div((int)mon->hp / 10);
          if (wVar16 < wVar17) {
            pcVar40 = "%s fiddles with the lock.";
            if ((char)local_10d8.x != '\0') {
              pcVar40 = "%s slams against the door.";
            }
            msg(pcVar40,&local_1088);
            square_set_door_lock((chunk *)cave,lVar23,wVar16 + L'\xffffffff');
          }
          if ((int)local_10f4 < (int)local_10c0) {
            _Var13 = monster_is_visible(mon);
            if (_Var13) {
              flag_on_dbg(local_10f0->flags,0xc,0x38,"lore->flags","RF_BASH_DOOR");
            }
            monster_slightly_stun_by_move(mon);
          }
        }
        else {
          _Var13 = square_isview(cave,lVar23);
          if (_Var13) {
            puVar2 = &player->upkeep->update;
            *puVar2 = *puVar2 | 0xc0;
          }
          if ((char)local_10d8.x != '\0') {
            square_smash_door(cave,lVar23);
            msg("You hear a door burst open!");
            disturb(player);
            if ((int)local_10f4 < (int)local_10c0) {
              _Var13 = monster_is_visible(mon);
              if (_Var13) {
                plVar37 = (loc *)0x237926;
                flag_on_dbg(local_10f0->flags,0xc,0x38,"lore->flags","RF_BASH_DOOR");
              }
              monster_slightly_stun_by_move(mon);
            }
            goto LAB_0017fb26;
          }
          square_open_door(cave,lVar23);
        }
        goto LAB_0018067b;
      }
      square_destroy_wall(cave,lVar23);
      _Var13 = square_isview(cave,lVar23);
      if (!_Var13) goto LAB_0017fb26;
    }
    puVar2 = &player->upkeep->update;
    *puVar2 = *puVar2 | 0xc0;
LAB_0017fb26:
    _Var13 = square_iswarded(cave,lVar23);
    if (_Var13) {
      _Var13 = square_iswarded(cave,lVar23);
      if (!_Var13) {
        __assert_fail("square_iswarded(cave, new)",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                      ,0x598,"_Bool monster_turn_attack_glyph(struct monster *, struct loc)");
      }
      uVar19 = Rand_div((uint)z_info->glyph_hardness);
      plVar37 = (loc *)mon->race;
      if (((monster_race *)plVar37)->level <= uVar19 + L'\x01') goto LAB_0018067b;
      ptVar22 = lookup_trap("glyph of warding");
      _Var13 = square_isseen(cave,lVar23);
      if (_Var13) {
        msg("The rune of protection is broken!");
      }
      if (ptVar22 == (trap_kind_conflict *)0x0) {
        __assert_fail("rune",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                      ,0x5a4,"_Bool monster_turn_attack_glyph(struct monster *, struct loc)");
      }
      square_remove_all_traps_of_type((chunk *)cave,lVar23,ptVar22->tidx);
    }
    _Var13 = square_isdecoyed(cave,lVar23);
    if (_Var13) {
      _Var13 = monster_is_visible(mon);
      if (_Var13) {
        flag_on_dbg((bitflag *)local_10b8,0xc,0x1a,"lore->flags","RF_NEVER_BLOW");
      }
      _Var13 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
      if (!_Var13) {
        square_destroy_decoy(cave,lVar23);
        goto LAB_00180d12;
      }
    }
    else {
      _Var13 = square_isplayer(cave,lVar23);
      if (_Var13) {
        if ((mon->target).midx == -1) {
          _Var13 = monster_is_visible(mon);
          if (_Var13) {
            flag_on_dbg((bitflag *)local_10b8,0xc,0x1a,"lore->flags","RF_NEVER_BLOW");
          }
          _Var13 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
          if (_Var13) goto LAB_0018067b;
          make_attack_normal((monster_conflict *)mon,player);
          goto LAB_00180d12;
        }
      }
      else {
        plVar37 = (loc *)0x22c420;
        _Var13 = flag_has_dbg(mon->race->flags,0xc,0x1b,"mon->race->flags","RF_NEVER_MOVE");
        if (_Var13) {
          _Var13 = monster_is_visible(mon);
          if (!_Var13) {
            return;
          }
          flag_on_dbg((bitflag *)local_10b8,0xc,0x1b,"lore->flags","RF_NEVER_MOVE");
          return;
        }
      }
      pmVar28 = square_monster(cave,lVar23);
      if (pmVar28 == (monster *)0x0) {
        grid1.x = (mon->grid).x;
        grid1.y = (mon->grid).y;
        monster_swap(grid1,lVar23);
        _Var13 = square_ismonstertrap(cave,lVar23);
        uVar38 = CONCAT71((int7)((ulong)plVar37 >> 8),1);
        wVar16 = (wchar_t)uVar38;
        if (_Var13) {
          monster_hit_trap((monster_conflict *)mon,lVar23,&local_1111);
          wVar16 = (wchar_t)CONCAT71((int7)((ulong)uVar38 >> 8),1);
        }
      }
      else {
        pmVar28 = square_monster(cave,lVar23);
        pmVar29 = cave_monster(cave,(mon->target).midx);
        if (pmVar28 == pmVar29) {
          pmVar32 = (monster_conflict *)cave_monster(cave,(mon->target).midx);
          monster_attack_monster((monster_conflict *)mon,pmVar32);
          wVar16 = local_1100.x;
        }
        else {
          pmVar32 = (monster_conflict *)square_monster(cave,lVar23);
          pmVar25 = get_lore(mon->race);
          _Var13 = monster_can_kill(mon,(loc_conflict)lVar23);
          _Var14 = monster_can_move(mon,(loc_conflict)lVar23);
          if (_Var14) {
            grid_02.x = (mon->grid).x;
            grid_02.y = (mon->grid).y;
            _Var14 = square_ispassable(cave,grid_02);
            uVar27 = CONCAT71(extraout_var,_Var14) & 0xffffffff;
          }
          else {
            uVar27 = 0;
          }
          wVar16 = (wchar_t)CONCAT71((int7)(uVar27 >> 8),(byte)uVar27 | _Var13);
          if ((uVar27 & 1) != 0 || _Var13) {
            local_1100.x = wVar16;
            monster_desc((char *)local_1038,0x50,(monster *)pmVar32,L'\x04');
            _Var14 = monster_is_visible(mon);
            if (_Var14) {
              flag_on_dbg(pmVar25->flags,0xc,0x3d,"lore->flags","RF_KILL_BODY");
              flag_on_dbg(pmVar25->flags,0xc,0x3c,"lore->flags","RF_MOVE_BODY");
            }
            _Var14 = monster_is_camouflaged((monster *)pmVar32);
            if (_Var14) {
              become_aware((chunk *)cave,pmVar32);
            }
            _Var14 = monster_is_visible(mon);
            if ((_Var14) && (_Var14 = monster_is_in_view(mon), _Var14)) {
              pcVar40 = "pushes past";
              if (_Var13) {
                pcVar40 = "tramples over";
              }
              msg("%s %s %s.",&local_1088,pcVar40,local_1038);
            }
            if (_Var13) {
              delete_monster((chunk *)cave,lVar23);
            }
            grid1_00.x = (mon->grid).x;
            grid1_00.y = (mon->grid).y;
            monster_swap(grid1_00,lVar23);
            _Var13 = square_ismonstertrap(cave,lVar23);
            if (_Var13) {
              monster_hit_trap((monster_conflict *)mon,lVar23,&local_1111);
            }
            wVar16 = local_1100.x;
          }
          wVar16 = wVar16 & 0xffffff01;
        }
      }
      if (local_1111 != false) {
        return;
      }
      local_1100.x = wVar16;
      pmVar28 = square_monster(cave,lVar23);
      if (pmVar28 == mon) {
        pmVar25 = get_lore(mon->race);
        _Var13 = monster_is_visible(mon);
        local_10f0 = (monster_lore *)CONCAT71(local_10f0._1_7_,_Var13);
        poVar30 = square_object(cave,lVar23);
        if (poVar30 != (object *)0x0) {
          bVar34 = (byte)local_10f0 ^ 1;
          do {
            _Var13 = tval_is_money(poVar30);
            if (!_Var13 && (bVar34 & 1) == 0) {
              flag_on_dbg(pmVar25->flags,0xc,0x3e,"lore->flags","RF_TAKE_ITEM");
              flag_on_dbg(pmVar25->flags,0xc,0x3f,"lore->flags","RF_KILL_ITEM");
              break;
            }
            poVar30 = poVar30->next;
          } while (poVar30 != (object *)0x0);
        }
        _Var13 = flag_has_dbg(mon->race->flags,0xc,0x3e,"mon->race->flags","RF_TAKE_ITEM");
        if ((_Var13) ||
           (_Var13 = flag_has_dbg(mon->race->flags,0xc,0x3f,"mon->race->flags","RF_KILL_ITEM"),
           _Var13)) {
          poVar30 = square_object(cave,lVar23);
joined_r0x0018026c:
          obj = poVar30;
          if (obj != (object *)0x0) {
            paVar8 = obj->artifact;
            poVar30 = obj->next;
            _Var13 = tval_is_money(obj);
            if ((!_Var13) && (obj->mimicking_m_idx == 0)) {
              object_desc((char *)local_1038,0x50,obj,0x43,player);
              _Var13 = react_to_slay(obj,(monster_conflict *)mon);
              _Var14 = flag_has_dbg(mon->race->flags,0xc,0x3e,"mon->race->flags","RF_TAKE_ITEM");
              if ((_Var13) || (paVar8 != (artifact *)0x0)) {
                if ((((_Var14 & (byte)local_10f0) == 1) &&
                    (_Var13 = square_isview(cave,lVar23), _Var13)) &&
                   (_Var13 = ignore_item_ok(player,obj), !_Var13)) {
                  msg("%s tries to pick up %s, but fails.",&local_1088,local_1038);
                }
                goto joined_r0x0018026c;
              }
              if (_Var14) {
                local_10a8 = object_new();
                object_copy(local_10a8,obj);
                local_10a8->oidx = 0;
                if (obj->known != (object *)0x0) {
                  poVar31 = object_new();
                  local_10a8->known = poVar31;
                  object_copy(poVar31,obj->known);
                  poVar31 = local_10a8->known;
                  poVar31->oidx = 0;
                  lVar26 = (loc)loc(0,0);
                  poVar31->grid = lVar26;
                }
                _Var13 = monster_carry((chunk *)cave,(monster_conflict *)mon,local_10a8);
                if (!_Var13) {
                  if (local_10a8->known != (object *)0x0) {
                    object_delete((chunk *)player->cave,(chunk *)0x0,&local_10a8->known);
                  }
                  object_delete((chunk *)cave,(chunk *)player->cave,&local_10a8);
                  goto joined_r0x0018026c;
                }
                _Var13 = square_isseen(cave,lVar23);
                if ((_Var13) && (_Var13 = ignore_item_ok(player,obj), !_Var13)) {
                  msg("%s picks up %s.",&local_1088,local_1038);
                }
              }
              else {
                _Var13 = square_isseen(cave,lVar23);
                if ((_Var13) && (_Var13 = ignore_item_ok(player,obj), !_Var13)) {
                  msgt(0x21,"%s crushes %s.",&local_1088,local_1038);
                }
              }
              square_delete_object(cave,lVar23,obj,true,true);
            }
            goto joined_r0x0018026c;
          }
        }
      }
    }
  }
LAB_0018067b:
  if (3 < uVar45) goto LAB_00180b06;
  uVar45 = uVar45 + 1;
  wVar16 = local_1100.x;
  if (((ulong)local_1100 & 1) != 0) {
LAB_00180b0a:
    if ((local_1100.x & 1U) == 0) {
      sVar4 = mon->m_timed[3];
      if (sVar4 == 0) {
        return;
      }
      mon_clear_timed(mon,L'\x03',L'\x04');
      mon_inc_timed(mon,L'\x06',(int)sVar4,L'\x01');
      return;
    }
LAB_00180d12:
    _Var13 = monster_is_visible(mon);
    if (_Var13) {
      flag_on_dbg((bitflag *)local_10b8,0xc,0x1b,"lore->flags","RF_NEVER_MOVE");
    }
    _Var13 = monster_is_visible(mon);
    if (((_Var13) && (_Var13 = monster_is_in_view(mon), _Var13)) && ((player->opts).opt[10] == true)
       ) {
      disturb(player);
    }
    _Var13 = monster_is_camouflaged(mon);
    if (!_Var13) {
      return;
    }
    become_aware((chunk *)cave,(monster_conflict *)mon);
    return;
  }
  goto LAB_0017fa7f;
}

Assistant:

static void monster_turn(struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);

	bool did_something = false;

	int i;
	int dir = 0;
	enum monster_stagger stagger;
	bool tracking = false;
	bool dead = false;
	char m_name[80];

	/* Get the monster name */
	monster_desc(m_name, sizeof(m_name), mon,
		MDESC_CAPITAL | MDESC_IND_HID | MDESC_COMMA);

	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, mon->grid)) {
		/* Learn web behaviour */
		if (monster_is_visible(mon)) {
			rf_on(lore->flags, RF_CLEAR_WEB);
			rf_on(lore->flags, RF_PASS_WEB);
		}

		/* If we can pass, no need to clear */
		if (!rf_has(mon->race->flags, RF_PASS_WEB)) {
			/* Learn wall behaviour */
			if (monster_is_visible(mon)) {
				rf_on(lore->flags, RF_PASS_WALL);
				rf_on(lore->flags, RF_KILL_WALL);
			}

			/* Now several possibilities */
			if (rf_has(mon->race->flags, RF_PASS_WALL)) {
				/* Insubstantial monsters go right through */
			} else if (monster_passes_walls(mon)) {
				/* If you can destroy a wall, you can destroy a web */
				struct trap_kind *web = lookup_trap("web");

				assert(web);
				square_remove_all_traps_of_type(cave,
					mon->grid, web->tidx);
			} else if (rf_has(mon->race->flags, RF_CLEAR_WEB)) {
				/* Clearing costs a turn (assume there are no other "traps") */
				struct trap_kind *web = lookup_trap("web");

				assert(web);
				square_remove_all_traps_of_type(cave,
					mon->grid, web->tidx);
				return;
			} else {
				/* Stuck */
				return;
			}
		}
	}

	/* Handle territorial monsters */
	if (rf_has(mon->race->flags, RF_TERRITORIAL) &&
		(level_topography(player->place) != TOP_CAVE)) {
		/* Territorial monsters get a direct energy boost when close to home */
		int from_home =	distance(mon->home, mon->grid);

		/* Step up in units of a fifth of monster detection range */
		for (i = 5; i > 0; i--) {
			if ((from_home * i) > (mon->race->hearing * 5))
				break;
		}

		/* Add some energy */
		mon->energy += (5 - i);

		/* If target is too far away from home, go back */
		if (distance(mon->home, mon->target.grid) >	5 * mon->race->hearing) {
			mon->target.grid = mon->home;
		}
	}

	/* Let other group monsters know about the player */
	monster_group_rouse(cave, mon);

	/* Try to multiply - this can use up a turn */
	if (monster_turn_multiply(mon))
		return;

	/* Monsters can speak.  -originally by TY- */
	if (one_in_(16) && rf_has(mon->race->flags, RF_SPEAKING) &&
		los(cave, mon->grid, player->grid) && !mon->m_timed[MON_TMD_FEAR]) {
		char bravado[80];

		/* Acquire the monster name/poss */
		if (monster_is_visible(mon)) {
			monster_desc(m_name, sizeof(m_name), mon, MDESC_CAPITAL);
		} else {
			strcpy(m_name, "It");
		}

		if (!get_rnd_line("bravado.txt", bravado)) {
			msg("%s %s", m_name, bravado);
		}
	} else if (rf_has(mon->race->flags, RF_PLAYER_GHOST)) {
		assert(cave->ghost);
		if (square_isview(cave, mon->grid) && (cave->ghost->string_type == 1)
			&& !cave->ghost->has_spoken && one_in_(3)) {
			/* Player ghosts may have a unique message they can say. */
			char ghost_name[80];

			/* Acquire the monster name/poss.  The player ghost will 
			 * always be identified, to heighten the effect.*/
			monster_desc(ghost_name, sizeof(ghost_name), mon, MDESC_SHOW);

			msg("%s says: '%s'", ghost_name, cave->ghost->string);
			cave->ghost->has_spoken = true;
		}
	}

	/* Attempt a ranged attack */
	if (make_ranged_attack(mon)) return;

	/* Work out what kind of movement to use - random movement or AI */
	stagger = monster_turn_should_stagger(mon);
	if (stagger == NO_STAGGER) {
		/* If there's no sensible move, we're done */
		if (!get_move(mon, &dir, &tracking)) return;
	}

	/* Try to move first in the chosen direction, or next either side of the
	 * chosen direction, or next at right angles to the chosen direction.
	 * Monsters which are tracking by sound or scent will not move if they
	 * can't move in their chosen direction. */
	for (i = 0; i < 5 && !did_something; i++) {
		/* Get the direction (or stagger) */
		int d = (stagger != NO_STAGGER) ? ddd[randint0(8)] : side_dirs[dir][i];

		/* Get the grid to step to or attack */
		struct loc new = loc_sum(mon->grid, ddgrid[d]);

		/* Tracking monsters have their best direction, don't change */
		if ((i > 0) && stagger == NO_STAGGER &&
			!square_isview(cave, mon->grid) && tracking) {
			break;
		}

		/* Check if we can move */
		if (!monster_turn_can_move(mon, m_name, new,
								   stagger == CONFUSED_STAGGER, &did_something))
			continue;

		/* Try to break the glyph if there is one.  This can happen multiple
		 * times per turn because failure does not break the loop */
		if (square_iswarded(cave, new) && !monster_turn_attack_glyph(mon, new))
			continue;

		/* Break a decoy if there is one */
		if (square_isdecoyed(cave, new)) {
			/* Learn about if the monster attacks */
			if (monster_is_visible(mon))
				rf_on(lore->flags, RF_NEVER_BLOW);

			/* Some monsters never attack */
			if (rf_has(mon->race->flags, RF_NEVER_BLOW))
				continue;

			/* Wait a minute... */
			square_destroy_decoy(cave, new);
			did_something = true;
			break;
		}

		/* The player is in the way. */
		if (square_isplayer(cave, new)) {
			if (mon->target.midx == -1) {
				/* Learn about if the monster attacks */
				if (monster_is_visible(mon))
					rf_on(lore->flags, RF_NEVER_BLOW);

				/* Some monsters never attack */
				if (rf_has(mon->race->flags, RF_NEVER_BLOW))
					continue;

				/* Otherwise, attack the player */
				make_attack_normal(mon, player);

				did_something = true;
				break;
			} else {
				/* Don't want to attack, so look for other options */
			}
		} else {
			/* Some monsters never move */
			if (rf_has(mon->race->flags, RF_NEVER_MOVE)) {
				/* Learn about lack of movement */
				if (monster_is_visible(mon))
					rf_on(lore->flags, RF_NEVER_MOVE);

				return;
			}
		}

		/* A monster is in the way, try to push past/kill */
		if (square_monster(cave, new)) {
			if (square_monster(cave, new) == cave_monster(cave,
														  mon->target.midx)) {
				monster_attack_monster(mon,
									   cave_monster(cave, mon->target.midx));
			} else {
				did_something = monster_turn_try_push(mon, m_name, new, &dead);
			}
		} else {
			/* Otherwise we can just move */
			monster_swap(mon->grid, new);

			/* Check for monster traps */
			if (square_ismonstertrap(cave, new)) {
				monster_hit_trap(mon, new, &dead);
			}
			did_something = true;
		}

		/* Monster may have died */
		if (dead) return;

		/* Scan all objects in the grid, if we reached it */
		if (mon == square_monster(cave, new)) {
			monster_turn_grab_objects(mon, m_name, new);
		}
	}

	if (did_something) {
		/* Learn about no lack of movement */
		if (monster_is_visible(mon))
			rf_on(lore->flags, RF_NEVER_MOVE);

		/* Possible disturb */
		if (monster_is_visible(mon) && monster_is_in_view(mon) && 
			OPT(player, disturb_near))
			disturb(player);		
	}

	/* Out of options - monster is paralyzed by fear (unless attacked) */
	if (!did_something && mon->m_timed[MON_TMD_FEAR]) {
		int amount = mon->m_timed[MON_TMD_FEAR];
		mon_clear_timed(mon, MON_TMD_FEAR, MON_TMD_FLG_NOMESSAGE);
		mon_inc_timed(mon, MON_TMD_HOLD, amount, MON_TMD_FLG_NOTIFY);
	}

	/* If we see an unaware monster do something, become aware of it */
	if (did_something && monster_is_camouflaged(mon))
		become_aware(cave, mon);
}